

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restrict.hpp
# Opt level: O1

ssize_t __thiscall
stream::
restricted_source<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>
::read(restricted_source<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,int __fd,void *__buf,size_t __nbytes)

{
  void *pvVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  
  if (0 < (long)__buf) {
    pvVar1 = (void *)this->remaining;
    if (pvVar1 == (void *)0x0) {
      uVar4 = 0xffffffffffffffff;
    }
    else {
      if (pvVar1 < __buf) {
        __buf = pvVar1;
      }
      plVar2 = *(long **)(*(long *)&(((this->base->
                                      super_chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
                                      ).pimpl_.px)->links_).
                                    super__List_base<boost::iostreams::detail::linked_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<boost::iostreams::detail::linked_streambuf<char,_std::char_traits<char>_>_*>_>
                                    ._M_impl + 0x10);
      uVar3 = (**(code **)(*plVar2 + 0x40))(plVar2,__fd,__buf);
      uVar4 = -(ulong)(*(uint *)(plVar2 + 8) & 1);
      if (uVar3 != 0) {
        uVar4 = uVar3;
      }
      if (0 < (long)uVar4) {
        uVar5 = 0;
        if (uVar4 <= this->remaining) {
          uVar5 = this->remaining - uVar4;
        }
        this->remaining = uVar5;
      }
    }
    return uVar4;
  }
  return 0;
}

Assistant:

std::streamsize read(char * buffer, std::streamsize bytes) {
		
		if(bytes <= 0) {
			return 0;
		}
		
		// Restrict the number of bytes to read
		bytes = std::streamsize(std::min(boost::uint64_t(bytes), remaining));
		if(bytes == 0) {
			return -1; // End of the restricted source reached
		}
		
		std::streamsize nread = boost::iostreams::read(base, buffer, bytes);
		
		// Remember how many bytes were read so far
		if(nread > 0) {
			remaining -= std::min(boost::uint64_t(nread), remaining);
		}
		
		return nread;
	}